

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O2

void __thiscall
kj::DestructorOnlyArrayDisposer::disposeImpl
          (DestructorOnlyArrayDisposer *this,void *firstElement,size_t elementSize,
          size_t elementCount,size_t capacity,_func_void_void_ptr *destroyElement)

{
  ExceptionSafeArrayUtil guard;
  ExceptionSafeArrayUtil local_28;
  
  if (destroyElement != (_func_void_void_ptr *)0x0) {
    local_28.pos = (byte *)((long)firstElement + elementCount * elementSize);
    local_28.elementSize = elementSize;
    local_28.constructedElementCount = elementCount;
    local_28.destroyElement = destroyElement;
    ExceptionSafeArrayUtil::destroyAll(&local_28);
    ExceptionSafeArrayUtil::~ExceptionSafeArrayUtil(&local_28);
  }
  return;
}

Assistant:

void DestructorOnlyArrayDisposer::disposeImpl(
    void* firstElement, size_t elementSize, size_t elementCount,
    size_t capacity, void (*destroyElement)(void*)) const {
  if (destroyElement != nullptr) {
    ExceptionSafeArrayUtil guard(firstElement, elementSize, elementCount, destroyElement);
    guard.destroyAll();
  }
}